

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_call_on_frame_received(nghttp2_session *session,nghttp2_frame *frame)

{
  int iVar1;
  int rv;
  nghttp2_frame *frame_local;
  nghttp2_session *session_local;
  
  if (((session->callbacks).on_frame_recv_callback == (nghttp2_on_frame_recv_callback)0x0) ||
     (iVar1 = (*(session->callbacks).on_frame_recv_callback)(session,frame,session->user_data),
     iVar1 == 0)) {
    session_local._4_4_ = 0;
  }
  else {
    session_local._4_4_ = -0x386;
  }
  return session_local._4_4_;
}

Assistant:

static int session_call_on_frame_received(nghttp2_session *session,
                                          nghttp2_frame *frame) {
  int rv;
  if (session->callbacks.on_frame_recv_callback) {
    rv = session->callbacks.on_frame_recv_callback(session, frame,
                                                   session->user_data);
    if (rv != 0) {
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    }
  }
  return 0;
}